

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t file_open_notify(apx_nodeInstance_t *self,apx_file_t *file)

{
  apx_fileType_t aVar1;
  uint32_t address_00;
  apx_fileManager_tag *file_manager_00;
  uint32_t address;
  apx_fileType_t file_type;
  apx_error_t retval;
  apx_fileManager_t *file_manager;
  apx_file_t *file_local;
  apx_nodeInstance_t *self_local;
  
  if ((((file == (apx_file_t *)0x0) || (self == (apx_nodeInstance_t *)0x0)) ||
      (self->node_data == (apx_nodeData_t *)0x0)) ||
     (file_manager_00 = apx_file_get_file_manager(file),
     file_manager_00 == (apx_fileManager_tag *)0x0)) {
    self_local._4_4_ = 0x24;
  }
  else {
    address = 0;
    aVar1 = apx_file_get_apx_file_type(file);
    address_00 = apx_file_get_address_without_flags(file);
    if (aVar1 == '\x01') {
      address = send_definition_data_to_file_manager(self,file_manager_00,address_00);
    }
    else if (aVar1 == '\x02') {
      address = send_provide_port_data_to_file_manager(self,file_manager_00,address_00);
    }
    else if (aVar1 == '\x03') {
      if (self->mode == '\x02') {
        if (self->server == (apx_server_tag *)0x0) {
          apx_nodeInstance_set_require_port_data_state(self,'\x04');
          address = send_require_port_data_to_file_manager(self,file_manager_00,address_00);
        }
        else {
          apx_server_take_global_lock(self->server);
          address = connect_require_ports_to_server(self);
          if (address == 0) {
            apx_nodeInstance_set_require_port_data_state(self,'\x04');
            address = send_require_port_data_to_file_manager(self,file_manager_00,address_00);
          }
          apx_server_release_global_lock(self->server);
        }
      }
    }
    else {
      address = 10;
    }
    self_local._4_4_ = address;
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t file_open_notify(apx_nodeInstance_t* self, apx_file_t* file)
{
   if ( (file != NULL) && (self != NULL) && (self->node_data != NULL) )
   {
      apx_fileManager_t* file_manager = apx_file_get_file_manager(file);
      if (file_manager != NULL)
      {
         apx_error_t retval = APX_NO_ERROR;
         apx_fileType_t file_type = apx_file_get_apx_file_type(file);
         uint32_t address = apx_file_get_address_without_flags(file);
         switch (file_type)
         {
         case APX_DEFINITION_FILE_TYPE:
            retval = send_definition_data_to_file_manager(self, file_manager, address);
            break;
         case APX_PROVIDE_PORT_DATA_FILE_TYPE:
            retval = send_provide_port_data_to_file_manager(self, file_manager, address);
            break;
         case APX_REQUIRE_PORT_DATA_FILE_TYPE:
            if (self->mode == APX_SERVER_MODE)
            {
               if (self->server != NULL)
               {
                  apx_server_take_global_lock(self->server);
                  retval = connect_require_ports_to_server(self);
                  if (retval == APX_NO_ERROR)
                  {
                     apx_nodeInstance_set_require_port_data_state(self, APX_DATA_STATE_CONNECTED);
                     //TODO:Take snapshot first, then release global lock, then transmit snapshot data through file manager.
                     //This shortens the time the global lock is held.
                     retval = send_require_port_data_to_file_manager(self, file_manager, address);
                  }
                  apx_server_release_global_lock(self->server);
               }
               else
               {
                  apx_nodeInstance_set_require_port_data_state(self, APX_DATA_STATE_CONNECTED);
                  retval = send_require_port_data_to_file_manager(self, file_manager, address);
               }
            }
            break;
         default:
            retval = APX_UNSUPPORTED_ERROR;
         }
         return retval;
      }
   }
   return APX_NULL_PTR_ERROR;
}